

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

bool __thiscall
testing::internal::FloatingPoint<float>::AlmostEquals
          (FloatingPoint<float> *this,FloatingPoint<float> *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->u_).bits_;
  if (((~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0) &&
     (uVar3 = (rhs->u_).bits_, (~uVar3 & 0x7f800000) != 0 || (uVar3 & 0x7fffff) == 0)) {
    uVar2 = uVar1 | 0x80000000;
    if ((int)uVar1 < 0) {
      uVar2 = -uVar1;
    }
    uVar1 = uVar3 | 0x80000000;
    if ((int)uVar3 < 0) {
      uVar1 = -uVar3;
    }
    uVar3 = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      uVar3 = -(uVar2 - uVar1);
    }
    return uVar3 < 5;
  }
  return false;
}

Assistant:

Bits exponent_bits() const { return kExponentBitMask & u_.bits_; }